

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

bool __thiscall dg::vr::RelationsAnalyzer::isSafe(RelationsAnalyzer *this,I inst)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  const_iterator cVar4;
  I pIVar5;
  long lVar6;
  undefined1 auVar7 [16];
  key_type local_30;
  
  cVar1 = llvm::Instruction::mayWriteToMemory();
  if ((cVar1 == '\0') && (cVar1 = llvm::Instruction::mayHaveSideEffects(), cVar1 == '\0')) {
    return true;
  }
  if (inst[0x10] == (Instruction)0x53) {
    bVar2 = llvm::IntrinsicInst::classof((CallInst *)inst);
    pIVar5 = (I)0x0;
    if (bVar2) {
      pIVar5 = inst;
    }
  }
  else {
    pIVar5 = (I)0x0;
  }
  if ((pIVar5 != (I)0x0) &&
     (bVar2 = isIgnorableIntrinsic(*(ID *)(*(long *)(pIVar5 + -0x20) + 0x24)), bVar2)) {
    return true;
  }
  if (inst[0x10] == (Instruction)0x53) {
    lVar3 = *(long *)(inst + -0x20);
    lVar6 = 0;
    if ((lVar3 != 0) && (*(char *)(lVar3 + 0x10) == '\0')) {
      lVar6 = lVar3;
    }
    if ((lVar6 == 0) || (*(long *)(lVar6 + 0x18) != *(long *)(inst + 0x48))) {
      lVar6 = 0;
    }
    if (lVar6 == 0) {
      bVar2 = false;
    }
    else {
      auVar7 = llvm::Value::getName();
      lVar3 = auVar7._0_8_;
      if (lVar3 == 0) {
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        local_30._M_string_length = 0;
        local_30.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_30,lVar3,auVar7._8_8_ + lVar3);
      }
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,&local_30);
      bVar2 = cVar4._M_node != (_Base_ptr)(this + 8);
    }
    if ((lVar6 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2)) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                               local_30.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool RelationsAnalyzer::isSafe(I inst) const {
    if (!inst->mayWriteToMemory() && !inst->mayHaveSideEffects())
        return true;

    if (const auto *intrinsic = llvm::dyn_cast<llvm::IntrinsicInst>(inst)) {
        if (isIgnorableIntrinsic(intrinsic->getIntrinsicID())) {
            return true;
        }
    }

    if (const auto *call = llvm::dyn_cast<llvm::CallInst>(inst)) {
        const auto *function = call->getCalledFunction();
        if (function && safeFunctions.find(function->getName().str()) !=
                                safeFunctions.end())
            return true;
    }
    return false;
}